

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkUnwantedModification(CheckerVisitor *this,CallExpr *call)

{
  bool bVar1;
  TreeOp TVar2;
  Expr *e;
  Expr *this_00;
  reference pvVar3;
  AccessExpr *this_01;
  CallExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Node *p;
  Expr *callee;
  SQChar *name;
  CallExpr *in_stack_ffffffffffffffe0;
  CheckerVisitor *in_stack_ffffffffffffffe8;
  
  if ((((in_RDI->effectsOnly & 1U) == 0) &&
      (e = (Expr *)extractFunctionName(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0),
      e != (Expr *)0x0)) && (bVar1 = nameLooksLikeModifiesObject((SQChar *)0x18e3c1), bVar1)) {
    this_00 = CallExpr::callee(in_RSI);
    bVar1 = Expr::isAccessExpr((Expr *)in_RDI);
    if (bVar1) {
      pvVar3 = std::
               vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
               ::back((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                       *)in_RDI);
      if (pvVar3->sst == SST_NODE) {
        pvVar3 = std::
                 vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                 ::back((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                         *)in_RDI);
        TVar2 = Node::op((pvVar3->field_1).n);
        if (TVar2 == TO_NEWSLOT) {
          return;
        }
      }
      this_01 = Expr::asAccessExpr(this_00);
      AccessExpr::receiver(this_01);
      bVar1 = isIndeterminated(e);
      if (bVar1) {
        report(in_RDI,(Node *)in_RSI,0x77,e);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkUnwantedModification(const CallExpr *call) {
  if (effectsOnly)
    return;

  const SQChar *name = extractFunctionName(call);

  if (!name)
    return;

  if (!nameLooksLikeModifiesObject(name))
    return;

  const Expr *callee = call->callee();

  if (!callee->isAccessExpr())
    return;

  if (nodeStack.back().sst == SST_NODE) {
    const Node *p = nodeStack.back().n;
    if (p->op() == TO_NEWSLOT)
      return;
  }

  if (isIndeterminated(callee->asAccessExpr()->receiver()))
    report(call, DiagnosticsId::DI_UNWANTED_MODIFICATION, name);
}